

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O0

void Cmd_info(FCommandLine *argv,APlayerPawn *who,int key)

{
  uint uVar1;
  DAngle *angle;
  bool bVar2;
  uint uVar3;
  MetaClass *pMVar4;
  char *pcVar5;
  undefined1 local_50 [24];
  undefined1 local_38 [8];
  FTranslatedLineTarget t;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  t._20_4_ = key;
  FTranslatedLineTarget::FTranslatedLineTarget((FTranslatedLineTarget *)local_38);
  bVar2 = CheckCheatmode(true);
  if ((!bVar2) && ((&players)[(long)consoleplayer * 0x54] != 0)) {
    angle = (DAngle *)(&players)[(long)consoleplayer * 0x54];
    TAngle<double>::TAngle
              ((TAngle<double> *)(local_50 + 0x10),
               (TAngle<double> *)((&players)[(long)consoleplayer * 0x54] + 0x90));
    TAngle<double>::TAngle((TAngle<double> *)(local_50 + 8),0.0);
    P_AimLineAttack((AActor *)local_50,angle,2048.0,(FTranslatedLineTarget *)(local_50 + 0x10),
                    (DAngle *)local_38,(int)local_50 + 8,(AActor *)0x5,(AActor *)0x0);
    if (local_38 == (undefined1  [8])0x0) {
      Printf(
            "No target found. Info cannot find actors that have the NOBLOCKMAP flag or have height/radius of 0.\n"
            );
    }
    else {
      pMVar4 = AActor::GetClass((AActor *)local_38);
      pcVar5 = FName::GetChars(&(pMVar4->super_PClass).super_PStruct.super_PNamedType.TypeName);
      uVar1 = *(int *)((long)local_38 + 0x1cc);
      uVar3 = AActor::SpawnHealth((AActor *)local_38);
      Printf("Target=%s, Health=%d, Spawnhealth=%d\n",pcVar5,(ulong)uVar1,(ulong)uVar3);
      PrintMiscActorInfo((AActor *)local_38);
    }
  }
  return;
}

Assistant:

CCMD(info)
{
	FTranslatedLineTarget t;

	if (CheckCheatmode () || players[consoleplayer].mo == NULL) return;
	P_AimLineAttack(players[consoleplayer].mo,players[consoleplayer].mo->Angles.Yaw, MISSILERANGE,
		&t, 0.,	ALF_CHECKNONSHOOTABLE|ALF_FORCENOSMART);
	if (t.linetarget)
	{
		Printf("Target=%s, Health=%d, Spawnhealth=%d\n",
			t.linetarget->GetClass()->TypeName.GetChars(),
			t.linetarget->health,
			t.linetarget->SpawnHealth());
		PrintMiscActorInfo(t.linetarget);
	}
	else Printf("No target found. Info cannot find actors that have "
				"the NOBLOCKMAP flag or have height/radius of 0.\n");
}